

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O0

void __thiscall
AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::
TestBody(AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
         *this)

{
  uint32_t sequence;
  uint32_t index;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  AssertHelper local_588;
  Message local_580;
  int local_578;
  uint32_t local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_3;
  Message local_558;
  AssertHelper local_550;
  Message local_548 [2];
  CfdException *anon_var_0_3;
  char *pcStack_530;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_520;
  int local_518;
  uint32_t local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_2;
  Message local_4f8;
  AbstractTxInReference local_4f0;
  ScriptWitness local_460;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_440;
  string local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_1;
  Message local_3f0;
  allocator local_3e1;
  string local_3e0;
  ByteData local_3c0;
  ScriptWitness local_3a8;
  AssertHelper local_388;
  Message local_380 [2];
  CfdException *anon_var_0_2;
  byte local_349;
  char *pcStack_348;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_338 [2];
  CfdException *anon_var_0_1;
  byte local_301;
  char *pcStack_300;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_2f0;
  AbstractTxInReference local_2e8;
  ScriptWitness local_258;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_238;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar;
  Message local_1e8;
  ScriptWitness local_1e0;
  allocator local_1b9;
  string local_1b8;
  undefined1 local_198 [8];
  ByteData bytedata2;
  Message local_178 [2];
  CfdException *anon_var_0;
  ScriptWitness local_160;
  byte local_139;
  char *pcStack_138;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData bytedata;
  string local_110;
  Script local_f0;
  allocator local_a1;
  string local_a0;
  Txid local_80;
  undefined1 local_60 [8];
  Transaction tx;
  uint32_t seq;
  uint32_t vout;
  uint32_t locktime;
  int32_t version;
  AbstractTransaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
  *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  cfd::core::Transaction::Transaction((Transaction *)local_60,2,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6",
             &local_a1);
  cfd::core::Txid::Txid(&local_80,&local_a0);
  index = tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  sequence = (uint32_t)
             tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac",
             (allocator *)
             ((long)&bytedata.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&local_f0,&local_110);
  cfd::core::Transaction::AddTxIn((Transaction *)local_60,&local_80,index,sequence,&local_f0);
  cfd::core::Script::~Script(&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bytedata.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Txid::~Txid(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_msg);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffec8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffec8);
  if (bVar1) {
    local_139 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::AddScriptWitnessStack
                (&local_160,(Transaction *)local_60,3,(ByteData *)&gtest_msg);
      cfd::core::ScriptWitness::~ScriptWitness(&local_160);
    }
    if ((local_139 & 1) == 0) {
      pcStack_138 = 
      "Expected: tx.AddScriptWitnessStack(3, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002c5b00;
    }
  }
  else {
LAB_002c5b00:
    testing::Message::Message(local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xc9,pcStack_138);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &bytedata2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_178);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b8,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763",&local_1b9);
  cfd::core::ByteData::ByteData((ByteData *)local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::AddScriptWitnessStack
                (&local_1e0,(Transaction *)local_60,0,(ByteData *)local_198);
      cfd::core::ScriptWitness::~ScriptWitness(&local_1e0);
    }
  }
  else {
    testing::Message::Message(&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xcd,
               "Expected: tx.AddScriptWitnessStack(0, bytedata2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1e8);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_2e8,(Transaction *)local_60,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_258,&local_2e8);
  cfd::core::ScriptWitness::GetWitness(&local_238,&local_258);
  pvVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_238,0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_220,pvVar2);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_200,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\"",pcVar3,
             "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  std::__cxx11::string::~string((string *)&local_220);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_238);
  cfd::core::ScriptWitness::~ScriptWitness(&local_258);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffd00,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffd00);
  if (bVar1) {
    local_301 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetScriptWitnessStack
                ((ScriptWitness *)&anon_var_0_1,(Transaction *)local_60,3,0,(ByteData *)&gtest_msg);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_1);
    }
    if ((local_301 & 1) == 0) {
      pcStack_300 = 
      "Expected: tx.SetScriptWitnessStack(3, 0, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002c611a;
    }
  }
  else {
LAB_002c611a:
    testing::Message::Message(local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd3,pcStack_300);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_338);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffcb8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffcb8);
  if (bVar1) {
    local_349 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::SetScriptWitnessStack
                ((ScriptWitness *)&anon_var_0_2,(Transaction *)local_60,3,3,(ByteData *)&gtest_msg);
      cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&anon_var_0_2);
    }
    if ((local_349 & 1) == 0) {
      pcStack_348 = 
      "Expected: tx.SetScriptWitnessStack(3, 3, bytedata) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002c62df;
    }
  }
  else {
LAB_002c62df:
    testing::Message::Message(local_380);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd4,pcStack_348);
    testing::internal::AssertHelper::operator=(&local_388,local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    testing::Message::~Message(local_380);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e0,"82780763",&local_3e1);
      cfd::core::ByteData::ByteData(&local_3c0,&local_3e0);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_3a8,(Transaction *)local_60,0,0,&local_3c0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_3a8);
      cfd::core::ByteData::~ByteData(&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    }
  }
  else {
    testing::Message::Message(&local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd5,
               "Expected: tx.SetScriptWitnessStack(0, 0, ByteData(\"82780763\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3f0);
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_4f0,(Transaction *)local_60,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_460,&local_4f0);
  cfd::core::ScriptWitness::GetWitness(&local_440,&local_460);
  pvVar2 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_440,0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_428,pvVar2);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_408,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()","\"82780763\"",
             pcVar3,"82780763");
  std::__cxx11::string::~string((string *)&local_428);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_440);
  cfd::core::ScriptWitness::~ScriptWitness(&local_460);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  local_514 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_60,0);
  local_518 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_510,"tx.GetScriptWitnessStackNum(0)","1",&local_514,&local_518
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffad0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffad0);
  if (bVar1) {
    anon_var_0_3._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)local_60,3);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) goto LAB_002c6afb;
    pcStack_530 = 
    "Expected: tx.RemoveScriptWitnessStackAll(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_548);
  testing::internal::AssertHelper::AssertHelper
            (&local_550,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0xdc,pcStack_530);
  testing::internal::AssertHelper::operator=(&local_550,local_548);
  testing::internal::AssertHelper::~AssertHelper(&local_550);
  testing::Message::~Message(local_548);
LAB_002c6afb:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)local_60,0);
    }
  }
  else {
    testing::Message::Message(&local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xdd,
               "Expected: tx.RemoveScriptWitnessStackAll(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_558);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_558);
  }
  local_574 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_60,0);
  local_578 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_570,"tx.GetScriptWitnessStackNum(0)","0",&local_574,&local_578
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xde,pcVar3);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
  cfd::core::ByteData::~ByteData((ByteData *)local_198);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_msg);
  cfd::core::Transaction::~Transaction((Transaction *)local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  ByteData bytedata;
  // AddScriptWitnessStack
  EXPECT_THROW(tx.AddScriptWitnessStack(3, bytedata), CfdException);

  ByteData bytedata2(
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, bytedata2));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "02158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");

  // SetScriptWitnessStack
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 0, bytedata), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(3, 3, bytedata), CfdException);
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("82780763")));
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "82780763");
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 1);

  // RemoveScriptWitnessStackAll
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}